

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O2

AlignmentLines *
Alnout::Writer<DNA>::ExtractAlignmentLines
          (AlignmentLines *__return_storage_ptr__,Sequence<DNA> *query,Sequence<DNA> *target,
          Cigar *alignment,size_t *outNumCols,size_t *outNumMatches,size_t *outNumGaps)

{
  CigarOp CVar1;
  _Map_pointer ppCVar2;
  ulong uVar3;
  ulong uVar4;
  CigarEntry CVar5;
  long lVar6;
  size_t index;
  anon_struct_128_7_d437573b local_1e8;
  undefined1 local_160 [8];
  Cigar cigar;
  AlignmentLine line;
  size_t local_60;
  CigarEntry local_58;
  _Elt_pointer local_50;
  size_t local_48;
  AlignmentLines *lines;
  
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::deque
            ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)local_160,
             &alignment->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
  if (cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      (_Map_pointer)
      cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_map_size) {
LAB_001729ee:
    lines = (AlignmentLines *)0x0;
    index = 0;
  }
  else {
    if (*(char *)(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                  super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                  super__Deque_impl_data._M_map_size + 4) == 'I') {
      index = (size_t)*(int *)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                              super__Deque_impl_data._M_map_size;
      lines = (AlignmentLines *)0x0;
    }
    else {
      if (*(char *)(cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                    super__Deque_impl_data._M_map_size + 4) != 'D') goto LAB_001729ee;
      lines = (AlignmentLines *)
              (long)*(int *)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                            super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                            super__Deque_impl_data._M_map_size;
      index = 0;
    }
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::pop_front
              ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)local_160);
  }
  if (cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node !=
      (_Map_pointer)
      cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
      super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
      _M_map_size) {
    ppCVar2 = cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    if ((_Elt_pointer)
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node ==
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur) {
      ppCVar2 = (_Map_pointer)
                ((long)cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                       super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
    }
    if ((*(char *)((long)ppCVar2 + -4) == 'I') || (*(char *)((long)ppCVar2 + -4) == 'D')) {
      std::deque<CigarEntry,_std::allocator<CigarEntry>_>::pop_back
                ((deque<CigarEntry,_std::allocator<CigarEntry>_> *)local_160);
    }
  }
  line.qe = (size_t)&line.q._M_string_length;
  line.q._M_dataplus._M_p = (pointer)0x0;
  line.q._M_string_length._0_1_ = 0;
  line.te = (size_t)&line.t._M_string_length;
  line.t._M_dataplus._M_p = (pointer)0x0;
  line.t._M_string_length._0_1_ = 0;
  line.t.field_2._8_8_ = &line.a._M_string_length;
  line.a._M_dataplus._M_p = (pointer)0x0;
  line.a._M_string_length._0_1_ = 0;
  cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
  super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)(index + 1);
  line.q.field_2._8_8_ =
       (long)&(lines->
              super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
              )._M_impl.super__Deque_impl_data._M_map + 1;
  std::
  _Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
  ::_Deque_base(&__return_storage_ptr__->
                 super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
               );
  local_58 = (CigarEntry)
             cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
  local_50 = cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  line.a.field_2._8_8_ =
       cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
       super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  local_48 = 0;
  local_60 = 0;
  uVar4 = 0;
  CVar5 = (CigarEntry)
          cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_map_size;
  do {
    uVar3 = uVar4;
    if (CVar5 == (CigarEntry)line.a.field_2._8_8_) {
      if (line.a._M_dataplus._M_p != (pointer)0x0) {
        line.ts = (size_t)lines;
        line.qs = index;
        std::
        deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
        ::push_back(__return_storage_ptr__,
                    (value_type *)
                    &cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                     super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
      }
      if (outNumCols != (size_t *)0x0) {
        *outNumCols = uVar3;
      }
      if (outNumMatches != (size_t *)0x0) {
        *outNumMatches = local_60;
      }
      if (outNumGaps != (size_t *)0x0) {
        *outNumGaps = local_48;
      }
      anon_struct_128_7_d437573b::~AlignmentLine
                ((anon_struct_128_7_d437573b *)
                 &cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                  super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      std::_Deque_base<CigarEntry,_std::allocator<CigarEntry>_>::~_Deque_base
                ((_Deque_base<CigarEntry,_std::allocator<CigarEntry>_> *)local_160);
      return __return_storage_ptr__;
    }
    lVar6 = 0;
    uVar4 = uVar3;
    while( true ) {
      uVar4 = uVar4 + 1;
      if (*(int *)CVar5 <= (int)lVar6) break;
      CVar1 = *(CigarOp *)((long)CVar5 + 4);
      if (CVar1 == Match) {
        local_60 = local_60 + 1;
LAB_00172bc3:
        Sequence<DNA>::operator[](query,index);
        std::__cxx11::string::push_back('\0');
        Sequence<DNA>::operator[](target,(size_t)lines);
        std::__cxx11::string::push_back((char)&line + '8');
        MatchSymbol(line.q._M_dataplus._M_p[line.qe - 1],line.t._M_dataplus._M_p[line.te - 1]);
        std::__cxx11::string::push_back((char)&line + 'X');
        index = index + 1;
        lines = (AlignmentLines *)
                ((long)&(lines->
                        super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                        )._M_impl.super__Deque_impl_data._M_map + 1);
      }
      else if (CVar1 == Deletion) {
        std::__cxx11::string::push_back('\0');
        Sequence<DNA>::operator[](target,(size_t)lines);
        std::__cxx11::string::push_back((char)&line + '8');
        std::__cxx11::string::push_back((char)&line + 'X');
        lines = (AlignmentLines *)
                ((long)&(lines->
                        super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                        )._M_impl.super__Deque_impl_data._M_map + 1);
LAB_00172bb9:
        local_48 = local_48 + 1;
      }
      else {
        if (CVar1 == Mismatch) goto LAB_00172bc3;
        if (CVar1 == Insertion) {
          std::__cxx11::string::push_back((char)&line + '8');
          Sequence<DNA>::operator[](query,index);
          std::__cxx11::string::push_back('\0');
          std::__cxx11::string::push_back((char)&line + 'X');
          index = index + 1;
          goto LAB_00172bb9;
        }
      }
      if ((uVar4 / 0x3c) * -0x3c + 1 + uVar3 + lVar6 == 0) {
        line.ts = (size_t)lines;
        line.qs = index;
        std::
        deque<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
        ::push_back(__return_storage_ptr__,
                    (value_type *)
                    &cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                     super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
        local_1e8.q._M_string_length = 0;
        local_1e8.q.field_2._8_8_ = 0;
        local_1e8.t._M_string_length = 0;
        local_1e8.t.field_2._8_8_ = 0;
        local_1e8.a._M_string_length = 0;
        local_1e8.a.field_2._8_8_ = 0;
        local_1e8.ts = 0;
        local_1e8.te = 0;
        local_1e8.qs = 0;
        local_1e8.qe = 0;
        local_1e8.q._M_dataplus._M_p = (pointer)&local_1e8.q.field_2;
        local_1e8.q.field_2._M_allocated_capacity = 0;
        local_1e8.t._M_dataplus._M_p = (pointer)&local_1e8.t.field_2;
        local_1e8.t.field_2._M_allocated_capacity = 0;
        local_1e8.a._M_dataplus._M_p = (pointer)&local_1e8.a.field_2;
        local_1e8.a.field_2._M_allocated_capacity = 0;
        anon_struct_128_7_d437573b::operator=
                  ((anon_struct_128_7_d437573b *)
                   &cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
                    super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,&local_1e8);
        anon_struct_128_7_d437573b::~AlignmentLine(&local_1e8);
        cigar.super_deque<CigarEntry,_std::allocator<CigarEntry>_>.
        super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node = (_Map_pointer)(index + 1);
        line.q.field_2._8_8_ =
             (long)&(lines->
                    super__Deque_base<Alnout::Writer<DNA>::AlignmentLine,_std::allocator<Alnout::Writer<DNA>::AlignmentLine>_>
                    )._M_impl.super__Deque_impl_data._M_map + 1;
      }
      lVar6 = lVar6 + 1;
    }
    CVar5 = (CigarEntry)((long)CVar5 + 8);
    uVar4 = uVar3 + lVar6;
    if (CVar5 == local_58) {
      CVar5 = local_50[1];
      local_50 = local_50 + 1;
      local_58 = (CigarEntry)((long)CVar5 + 0x200);
      uVar4 = uVar3 + lVar6;
    }
  } while( true );
}

Assistant:

static AlignmentLines ExtractAlignmentLines(
    const Sequence< Alphabet >& query, const Sequence< Alphabet >& target,
    const Cigar& alignment, size_t* outNumCols = NULL,
    size_t* outNumMatches = NULL, size_t* outNumGaps = NULL ) {
    Cigar cigar = alignment;

    size_t queryStart  = 0;
    size_t targetStart = 0;

    // Dont take left terminal gap into account
    if( !cigar.empty() ) {
      const auto& fce = cigar.front();
      if( fce.op == CigarOp::Deletion ) {
        targetStart = fce.count;
        cigar.pop_front();
      } else if( fce.op == CigarOp::Insertion ) {
        queryStart = fce.count;
        cigar.pop_front();
      }
    }

    // Don't take right terminal gap into account
    if( !cigar.empty() ) {
      const auto& bce = cigar.back();
      if( bce.op == CigarOp::Deletion ) {
        cigar.pop_back();
      } else if( bce.op == CigarOp::Insertion ) {
        cigar.pop_back();
      }
    }

    bool   match;
    size_t numMatches = 0;
    size_t numCols    = 0;
    size_t numGaps    = 0;

    size_t qcount = queryStart;
    size_t tcount = targetStart;

    AlignmentLine line;
    line.qs = queryStart + 1;
    line.ts = targetStart + 1;

    AlignmentLines lines;

    for( auto& c : cigar ) {
      for( int i = 0; i < c.count; i++ ) {
        switch( c.op ) {
          case CigarOp::Insertion:
            line.t += '-';
            line.q += query[ qcount++ ];
            line.a += ' ';
            numGaps++;
            break;

          case CigarOp::Deletion:
            line.q += '-';
            line.t += target[ tcount++ ];
            line.a += ' ';
            numGaps++;
            break;

          case CigarOp::Match: // specific for match
            numMatches++;
          case CigarOp::Mismatch: // match and mismatch
            line.q += query[ qcount++ ];
            line.t += target[ tcount++ ];
            {
              const char a = line.q.back(), b = line.t.back();
              line.a += MatchSymbol( a, b );
            }
            break;

          default:
            break;
        }

        numCols++;
        if( numCols % MaxLineLength == 0 ) {
          line.qe = qcount;
          line.te = tcount;
          lines.push_back( line );

          // Start new line
          line    = AlignmentLine();
          line.qs = qcount + 1;
          line.ts = tcount + 1;
        }
      }
    }

    if( !line.a.empty() ) {
      line.qe = qcount;
      line.te = tcount;
      lines.push_back( line );
    }

    if( outNumCols )
      *outNumCols = numCols;

    if( outNumMatches )
      *outNumMatches = numMatches;

    if( outNumGaps )
      *outNumGaps = numGaps;

    return lines;
  }